

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

void hash_final(permutation_fptr permutation,ascon_hash_ctx_t *ctx,uint8_t *digest,size_t digest_len
               )

{
  uint64_t uVar1;
  ulong in_RCX;
  uint8_t *in_RDX;
  ascon_hash_ctx_t *in_RSI;
  code *in_RDI;
  ulong local_20;
  uint8_t *local_18;
  
  uVar1 = bigendian_decode_varlen(in_RSI->buffer,in_RSI->buffer_len);
  (in_RSI->sponge).x0 = uVar1 ^ (in_RSI->sponge).x0;
  (in_RSI->sponge).x0 = 0x80L << (in_RSI->buffer_len * -8 + 0x38 & 0x3f) ^ (in_RSI->sponge).x0;
  ascon_permutation_12((ascon_sponge_t *)0x104d84);
  local_18 = in_RDX;
  for (local_20 = in_RCX; 8 < local_20; local_20 = local_20 - 8) {
    bigendian_encode_u64(local_18,(in_RSI->sponge).x0);
    (*in_RDI)(in_RSI);
    local_18 = local_18 + 8;
  }
  bigendian_encode_varlen(local_18,(in_RSI->sponge).x0,(uint_fast8_t)local_20);
  ascon_hash_cleanup(in_RSI);
  return;
}

Assistant:

static void
hash_final(permutation_fptr permutation,
           ascon_hash_ctx_t* const ctx,
           uint8_t* digest,
           size_t digest_len)
{
    // If there is any remaining less-than-a-block data to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->sponge.x0 ^= bigendian_decode_varlen(ctx->buffer, ctx->buffer_len);
    ctx->sponge.x0 ^= PADDING(ctx->buffer_len);
    ascon_permutation_12(&ctx->sponge);
    // Squeeze the digest from the inner state.
    while (digest_len > ASCON_RATE)
    {
        bigendian_encode_u64(digest, ctx->sponge.x0);
        permutation(&ctx->sponge);
        digest_len -= ASCON_RATE;
        digest += ASCON_RATE;
    }
    bigendian_encode_varlen(digest, ctx->sponge.x0, (uint_fast8_t) digest_len);
    // Final security cleanup of the internal state and buffer.
    ascon_hash_cleanup(ctx);
}